

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

resource loader::anon_unknown_0::ne_reader::find_resource(istream *is,uint32_t name,uint32_t type)

{
  resource rVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  ulong uVar7;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  uint16_t name_id;
  uint16_t size;
  uint16_t offset;
  uint16_t i;
  uint16_t type_id;
  uint16_t name_count;
  uint16_t shift;
  uint16_t resources_end;
  uint16_t resources_offset;
  resource result;
  ushort local_24;
  uint32_t local_8;
  uint32_t uStack_4;
  
  uStack_4 = 0;
  local_8 = 0;
  std::istream::seekg(in_RDI,0x22);
  uVar2 = util::load<unsigned_short>((istream *)0x16880f);
  uVar3 = util::load<unsigned_short>((istream *)0x16881e);
  uVar7 = std::ios::fail();
  if (((uVar7 & 1) == 0) && (uVar3 != uVar2)) {
    std::istream::seekg(in_RDI,uVar2 - 0x28);
    uVar2 = util::load<unsigned_short>((istream *)0x168876);
    uVar7 = std::ios::fail();
    if (((uVar7 & 1) == 0) && (uVar2 < 0x20)) {
      while( true ) {
        uVar3 = util::load<unsigned_short>((istream *)0x1688ab);
        uVar4 = util::load<unsigned_short>((istream *)0x1688ba);
        std::istream::seekg(in_RDI,4);
        uVar7 = std::ios::fail();
        if (((uVar7 & 1) != 0) || (uVar3 == 0)) break;
        if (uVar3 == (in_DX | 0x8000)) {
          local_24 = 0;
          goto LAB_00168935;
        }
        std::istream::seekg(in_RDI,(uint)uVar4 * 0xc);
      }
    }
  }
LAB_00168a04:
  rVar1.size = uStack_4;
  rVar1.offset = local_8;
  return rVar1;
LAB_00168935:
  if (uVar4 <= local_24) goto LAB_00168a04;
  uVar3 = util::load<unsigned_short>((istream *)0x168951);
  uVar5 = util::load<unsigned_short>((istream *)0x168960);
  std::istream::seekg(in_RDI,_S_end);
  uVar6 = util::load<unsigned_short>((istream *)0x168983);
  std::istream::seekg(in_RDI,4);
  uVar7 = std::ios::fail();
  if ((uVar7 & 1) != 0) goto LAB_00168a04;
  if (uVar6 == (in_SI | 0x8000)) {
    local_8 = (uint)uVar3 << ((byte)uVar2 & 0x1f);
    uStack_4 = (uint)uVar5 << ((byte)uVar2 & 0x1f);
    goto LAB_00168a04;
  }
  local_24 = local_24 + 1;
  goto LAB_00168935;
}

Assistant:

exe_reader::resource ne_reader::find_resource(std::istream & is, boost::uint32_t name,
                                              boost::uint32_t type) {
	
	resource result;
	result.offset = result.size = 0;
	
	is.seekg(0x24 - 2, std::ios_base::cur); // Already read the magic
	boost::uint16_t resources_offset = util::load<boost::uint16_t>(is);
	boost::uint16_t resources_end = util::load<boost::uint16_t>(is);
	if(is.fail()) {
		return result;
	}
	
	if(resources_end == resources_offset) {
		return result;
	}
	
	is.seekg(std::streamoff(resources_offset) - 0x28, std::ios_base::cur);
	
	boost::uint16_t shift = util::load<boost::uint16_t>(is);
	if(is.fail() || shift >= 32) {
		return result;
	}
	
	boost::uint16_t name_count;
	for(;;) {
		
		boost::uint16_t type_id = util::load<boost::uint16_t>(is);
		name_count = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail() || type_id == 0) {
			return result;
		}
		
		if(type_id == boost::uint16_t(type | 0x8000)) {
			break;
		}
		
		is.seekg(name_count * 12, std::ios_base::cur);
		
	}
	
	for(boost::uint16_t i = 0; i < name_count; i++) {
		
		boost::uint16_t offset = util::load<boost::uint16_t>(is);
		boost::uint16_t size   = util::load<boost::uint16_t>(is);
		is.seekg(2, std::ios_base::cur);
		boost::uint16_t name_id = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail()) {
			return result;
		}
		
		if(name_id == boost::uint16_t(name | 0x8000)) {
			result.offset = boost::uint32_t(offset) << shift;
			result.size   = boost::uint32_t(size)   << shift;
			break;
		}
		
	}
	
	return result;
}